

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O3

void createVars(vec<vec<BoolView>_> *x,int n,int m)

{
  BoolView *pBVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  vec<vec<BoolView>_>::growTo(x,n);
  if (0 < n) {
    uVar4 = 0;
    do {
      vec<BoolView>::growTo(x->data + uVar4,m);
      if (0 < m) {
        lVar3 = 0;
        do {
          iVar2 = SAT::newVar(&sat,1,(ChannelInfo)0x0);
          pBVar1 = x->data[uVar4].data;
          *(int *)((long)&pBVar1->v + lVar3) = iVar2;
          (&pBVar1->s)[lVar3] = false;
          lVar3 = lVar3 + 0x10;
        } while ((ulong)(uint)m << 4 != lVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)n);
  }
  return;
}

Assistant:

void createVars(vec<vec<BoolView> >& x, int n, int m) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i].growTo(m);
		for (int j = 0; j < m; j++) {
			x[i][j] = newBoolVar();
		}
	}
}